

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

SUNErrCode N_VDotProdMultiLocal(int nvec,N_Vector x,N_Vector *Y,sunrealtype *dotprods)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  undefined8 uVar1;
  int i;
  SUNErrCode ier;
  SUNContext sunctx_local_scope_;
  undefined4 local_30;
  undefined4 local_2c;
  
  if (*(long *)(*(long *)(in_RSI + 8) + 0x188) == 0) {
    if (*(long *)(*(long *)(in_RSI + 8) + 0x140) != 0) {
      for (local_30 = 0; local_30 < in_EDI; local_30 = local_30 + 1) {
        uVar1 = (**(code **)(*(long *)(in_RSI + 8) + 0x140))
                          (in_RSI,*(undefined8 *)(in_RDX + (long)local_30 * 8));
        *(undefined8 *)(in_RCX + (long)local_30 * 8) = uVar1;
      }
    }
    local_2c = 0;
  }
  else {
    local_2c = (**(code **)(*(long *)(in_RSI + 8) + 0x188))(in_EDI,in_RSI,in_RDX,in_RCX);
  }
  return local_2c;
}

Assistant:

SUNErrCode N_VDotProdMultiLocal(int nvec, N_Vector x, N_Vector* Y,
                                sunrealtype* dotprods)
{
  SUNFunctionBegin(x->sunctx);
  SUNErrCode ier = SUN_SUCCESS;
  int i          = 0;

  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(x));

  SUNAssert(x->ops->nvdotprodmultilocal || x->ops->nvdotprodlocal,
            SUN_ERR_NOT_IMPLEMENTED);

  if (x->ops->nvdotprodmultilocal)
  {
    ier = x->ops->nvdotprodmultilocal(nvec, x, Y, dotprods);
  }
  else if (x->ops->nvdotprodlocal)
  {
    for (i = 0; i < nvec; i++)
    {
      dotprods[i] = x->ops->nvdotprodlocal(x, Y[i]);
    }
    ier = SUN_SUCCESS;
  }

  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(x));

  return ier;
}